

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_InitializeWithIndexAndValue_Test<pstore::uint128>::
~SparseArray_InitializeWithIndexAndValue_Test
          (SparseArray_InitializeWithIndexAndValue_Test<pstore::uint128> *this)

{
  SparseArray_InitializeWithIndexAndValue_Test<pstore::uint128> *this_local;
  
  ~SparseArray_InitializeWithIndexAndValue_Test(this);
  ::operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, InitializeWithIndexAndValue) {
    auto arrp = sparse_array<int, TypeParam>::make_unique ({0, 2, 4}, {1, 2, 3});
    auto & arr = *arrp;

    EXPECT_EQ (arr.size (), 3U);
    EXPECT_TRUE (arr.has_index (0));
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_TRUE (arr.has_index (2));
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_FALSE (arr.has_index (256));
    EXPECT_EQ (arr[0], 1);
    EXPECT_EQ (arr[2], 2);
    EXPECT_EQ (arr[4], 3);
}